

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformSelectNodeInternal
          (Transformer *this,PGSelectStmt *select,bool is_select)

{
  ParserException *pPVar1;
  int in_ECX;
  undefined7 in_register_00000011;
  long lVar2;
  allocator local_41;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_40;
  _Alloc_hider local_38;
  
  lVar2 = CONCAT71(in_register_00000011,is_select);
  if (in_ECX != 0) {
    if (*(long *)(lVar2 + 0x10) != 0) {
      pPVar1 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc8,"SELECT INTO not supported!",&local_41);
      ParserException::ParserException(pPVar1,(string *)&stack0xffffffffffffffc8);
      __cxa_throw(pPVar1,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(long *)(lVar2 + 0x80) != 0) {
      pPVar1 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc8,"SELECT locking clause is not supported!",
                 &local_41);
      ParserException::ParserException(pPVar1,(string *)&stack0xffffffffffffffc8);
      __cxa_throw(pPVar1,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (*(long *)(lVar2 + 0x58) == 0) {
    TransformSelectInternal((Transformer *)&stack0xffffffffffffffc8,select);
  }
  else {
    TransformPivotStatement((Transformer *)&stack0xffffffffffffffc8,select);
  }
  local_40._M_head_impl = (QueryNode *)local_38._M_p;
  TransformMaterializedCTE
            (this,(unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                  &local_40);
  if ((Transformer *)local_40._M_head_impl != (Transformer *)0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)&(local_40._M_head_impl)->_vptr_QueryNode)
              ->ptr->options)();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformSelectNodeInternal(duckdb_libpgquery::PGSelectStmt &select,
                                                               bool is_select) {
	// Both Insert/Create Table As uses this.
	if (is_select) {
		if (select.intoClause) {
			throw ParserException("SELECT INTO not supported!");
		}
		if (select.lockingClause) {
			throw ParserException("SELECT locking clause is not supported!");
		}
	}
	unique_ptr<QueryNode> stmt = nullptr;
	if (select.pivot) {
		stmt = TransformPivotStatement(select);
	} else {
		stmt = TransformSelectInternal(select);
	}
	return TransformMaterializedCTE(std::move(stmt));
}